

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

Scene * __thiscall CMU462::DynamicScene::Scene::get_transformed_static_scene(Scene *this,double t)

{
  _Base_ptr p_Var1;
  Scene *this_00;
  _Rb_tree_header *p_Var2;
  SceneObject *staticObject;
  vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  staticObjects;
  vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  staticLights;
  SceneLight *local_70;
  vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  local_68;
  vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  local_48;
  double local_30;
  
  local_68.
  super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (SceneObject **)0x0;
  local_68.
  super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (SceneObject **)0x0;
  local_48.
  super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  local_30 = t;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_70 = (SceneLight *)(**(code **)(**(long **)(p_Var1 + 1) + 0x40))(SUB84(local_30,0));
      if (local_70 != (SceneLight *)0x0) {
        if (local_68.
            super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_68.
            super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<CMU462::StaticScene::SceneObject*,std::allocator<CMU462::StaticScene::SceneObject*>>
          ::_M_realloc_insert<CMU462::StaticScene::SceneObject*const&>
                    ((vector<CMU462::StaticScene::SceneObject*,std::allocator<CMU462::StaticScene::SceneObject*>>
                      *)&local_68,
                     (iterator)
                     local_68.
                     super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(SceneObject **)&local_70);
        }
        else {
          *local_68.
           super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = (SceneObject *)local_70;
          local_68.
          super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  p_Var1 = (this->lights)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->lights)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_70 = (SceneLight *)(**(code **)**(undefined8 **)(p_Var1 + 1))();
      std::vector<CMU462::StaticScene::SceneLight*,std::allocator<CMU462::StaticScene::SceneLight*>>
      ::emplace_back<CMU462::StaticScene::SceneLight*>
                ((vector<CMU462::StaticScene::SceneLight*,std::allocator<CMU462::StaticScene::SceneLight*>>
                  *)&local_48,&local_70);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  this_00 = (Scene *)operator_new(0x30);
  StaticScene::Scene::Scene(this_00,&local_68,&local_48);
  if (local_48.
      super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.
      super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return this_00;
}

Assistant:

StaticScene::Scene *Scene::get_transformed_static_scene(double t) {
  std::vector<StaticScene::SceneObject *> staticObjects;
  std::vector<StaticScene::SceneLight *> staticLights;

  for (SceneObject *obj : objects) {
    auto staticObject = obj->get_transformed_static_object(t);
    if (staticObject != nullptr)
      staticObjects.push_back(staticObject);
  }
  for (SceneLight *light : lights) {
    staticLights.push_back(light->get_static_light());
  }
  return new StaticScene::Scene(staticObjects, staticLights);
}